

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O1

bool kratos::IterVar::safe_to_resize(Var *var,uint32_t target_size,bool is_signed)

{
  bool bVar1;
  int iVar2;
  IterVar **v;
  IterVar **__args;
  optional<long> value;
  undefined1 auStack_a8 [8];
  queue<const_kratos::IterVar_*,_std::deque<const_kratos::IterVar_*,_std::allocator<const_kratos::IterVar_*>_>_>
  queue;
  vector<const_kratos::IterVar_*,_std::allocator<const_kratos::IterVar_*>_> iters;
  
  queue.c.super__Deque_base<const_kratos::IterVar_*,_std::allocator<const_kratos::IterVar_*>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  extract_iter_var(var,(vector<const_kratos::IterVar_*,_std::allocator<const_kratos::IterVar_*>_> *)
                       &queue.c.
                        super__Deque_base<const_kratos::IterVar_*,_std::allocator<const_kratos::IterVar_*>_>
                        ._M_impl.super__Deque_impl_data._M_finish._M_node);
  if (safe_to_resize(kratos::Var_const*,unsigned_int,bool)::sim == '\0') {
    iVar2 = __cxa_guard_acquire(&safe_to_resize(kratos::Var_const*,unsigned_int,bool)::sim);
    if (iVar2 != 0) {
      Simulator::Simulator(&safe_to_resize::sim,(Generator *)0x0);
      __cxa_atexit(Simulator::~Simulator,&safe_to_resize::sim,&__dso_handle);
      __cxa_guard_release(&safe_to_resize(kratos::Var_const*,unsigned_int,bool)::sim);
    }
  }
  queue.c.super__Deque_base<const_kratos::IterVar_*,_std::allocator<const_kratos::IterVar_*>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  queue.c.super__Deque_base<const_kratos::IterVar_*,_std::allocator<const_kratos::IterVar_*>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  queue.c.super__Deque_base<const_kratos::IterVar_*,_std::allocator<const_kratos::IterVar_*>_>.
  _M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  queue.c.super__Deque_base<const_kratos::IterVar_*,_std::allocator<const_kratos::IterVar_*>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  queue.c.super__Deque_base<const_kratos::IterVar_*,_std::allocator<const_kratos::IterVar_*>_>.
  _M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  queue.c.super__Deque_base<const_kratos::IterVar_*,_std::allocator<const_kratos::IterVar_*>_>.
  _M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  queue.c.super__Deque_base<const_kratos::IterVar_*,_std::allocator<const_kratos::IterVar_*>_>.
  _M_impl.super__Deque_impl_data._M_map_size = 0;
  queue.c.super__Deque_base<const_kratos::IterVar_*,_std::allocator<const_kratos::IterVar_*>_>.
  _M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  auStack_a8 = (undefined1  [8])0x0;
  queue.c.super__Deque_base<const_kratos::IterVar_*,_std::allocator<const_kratos::IterVar_*>_>.
  _M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  std::_Deque_base<const_kratos::IterVar_*,_std::allocator<const_kratos::IterVar_*>_>::
  _M_initialize_map((_Deque_base<const_kratos::IterVar_*,_std::allocator<const_kratos::IterVar_*>_>
                     *)auStack_a8,0);
  if (queue.c.super__Deque_base<const_kratos::IterVar_*,_std::allocator<const_kratos::IterVar_*>_>.
      _M_impl.super__Deque_impl_data._M_finish._M_node != (_Map_pointer)0x0) {
    __args = (IterVar **)
             queue.c.
             super__Deque_base<const_kratos::IterVar_*,_std::allocator<const_kratos::IterVar_*>_>.
             _M_impl.super__Deque_impl_data._M_finish._M_node;
    do {
      value.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
      _M_payload._M_value = (*__args)->max_value_ + -1;
      value.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
      _8_8_ = 1;
      Simulator::set_i(&safe_to_resize::sim,&(*__args)->super_Var,value,false);
      std::deque<kratos::IterVar_const*,std::allocator<kratos::IterVar_const*>>::
      emplace_back<kratos::IterVar_const*const&>
                ((deque<kratos::IterVar_const*,std::allocator<kratos::IterVar_const*>> *)auStack_a8,
                 __args);
      __args = __args + 1;
    } while (__args != (IterVar **)0x0);
  }
  bVar1 = safe_to_resize_(&safe_to_resize::sim,var,target_size,is_signed,
                          (queue<const_kratos::IterVar_*,_std::deque<const_kratos::IterVar_*,_std::allocator<const_kratos::IterVar_*>_>_>
                           *)auStack_a8);
  std::_Deque_base<const_kratos::IterVar_*,_std::allocator<const_kratos::IterVar_*>_>::~_Deque_base
            ((_Deque_base<const_kratos::IterVar_*,_std::allocator<const_kratos::IterVar_*>_> *)
             auStack_a8);
  if (queue.c.super__Deque_base<const_kratos::IterVar_*,_std::allocator<const_kratos::IterVar_*>_>.
      _M_impl.super__Deque_impl_data._M_finish._M_node != (_Map_pointer)0x0) {
    operator_delete(queue.c.
                    super__Deque_base<const_kratos::IterVar_*,_std::allocator<const_kratos::IterVar_*>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_node,
                    -(long)queue.c.
                           super__Deque_base<const_kratos::IterVar_*,_std::allocator<const_kratos::IterVar_*>_>
                           ._M_impl.super__Deque_impl_data._M_finish._M_node);
  }
  return bVar1;
}

Assistant:

bool IterVar::safe_to_resize(const Var *var, uint32_t target_size, bool is_signed) {
    std::vector<const IterVar *> iters;
    extract_iter_var(var, iters);
    // brute-force to compute every possible combinations using simulator
    static Simulator sim(nullptr);
    // We did some hacks that, assuming the min and max value is at the boundary
    // maybe use an SMT solver?
    std::queue<const IterVar *> queue;
    for (auto const &v : iters) {
        sim.set_i(v, v->max_value() - 1, false);
        queue.emplace(v);
    }

    auto result = safe_to_resize_(sim, var, target_size, is_signed, queue);

    return result;
}